

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O0

void resolv_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  void *pvVar2;
  int local_2c;
  int i;
  nni_resolv_item *item;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  nni_mtx_lock(&resolv_mtx);
  pvVar2 = nni_aio_get_prov_data(aio);
  if (arg == pvVar2) {
    nni_aio_set_prov_data(aio,(void *)0x0);
    iVar1 = nni_aio_list_active(aio);
    if (iVar1 == 0) {
      for (local_2c = 0; local_2c < resolv_num_thr; local_2c = local_2c + 1) {
        if (resolv_active[local_2c] == aio) {
          resolv_active[local_2c] = (nni_aio *)0x0;
          break;
        }
      }
    }
    else {
      nni_aio_list_remove(aio);
    }
    nni_mtx_unlock(&resolv_mtx);
    nni_aio_finish_error(aio,rv);
  }
  else {
    nni_mtx_unlock(&resolv_mtx);
  }
  return;
}

Assistant:

static void
resolv_cancel(nni_aio *aio, void *arg, int rv)
{
	nni_resolv_item *item = arg;

	nni_mtx_lock(&resolv_mtx);
	if (item != nni_aio_get_prov_data(aio)) {
		// Already canceled?
		nni_mtx_unlock(&resolv_mtx);
		return;
	}
	nni_aio_set_prov_data(aio, NULL);
	if (nni_aio_list_active(aio)) {
		// We have not been picked up by a resolver thread yet,
		// so we can just discard everything.
		nni_aio_list_remove(aio);
	} else {
		// Remove it from the thread pending list.  We cannot abort
		// the actual lookup, but this abandons interest in it, and
		// the resolver thread will pick the next item when done.
		for (int i = 0; i < resolv_num_thr; i++) {
			if (resolv_active[i] == aio) {
				resolv_active[i] = NULL;
				break;
			}
		}
	}
	nni_mtx_unlock(&resolv_mtx);
	nni_aio_finish_error(aio, rv);
}